

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::pushSelector
          (TIntermediate *this,TIntermSequence *sequence,TMatrixSelector *selector,TSourceLoc *loc)

{
  TIntermConstantUnion *local_40;
  TIntermConstantUnion *local_38;
  TIntermConstantUnion *local_30;
  TIntermConstantUnion *constIntNode;
  TSourceLoc *loc_local;
  TMatrixSelector *selector_local;
  TIntermSequence *sequence_local;
  TIntermediate *this_local;
  
  constIntNode = (TIntermConstantUnion *)loc;
  loc_local = (TSourceLoc *)selector;
  selector_local = (TMatrixSelector *)sequence;
  sequence_local = (TIntermSequence *)this;
  local_38 = addConstantUnion(this,selector->coord1,loc,false);
  local_30 = local_38;
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)selector_local,
             (value_type *)&local_38);
  local_40 = addConstantUnion(this,*(int *)((long)&loc_local->name + 4),(TSourceLoc *)constIntNode,
                              false);
  local_30 = local_40;
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)selector_local,
             (value_type *)&local_40);
  return;
}

Assistant:

void TIntermediate::pushSelector(TIntermSequence& sequence, const TMatrixSelector& selector, const TSourceLoc& loc)
{
    TIntermConstantUnion* constIntNode = addConstantUnion(selector.coord1, loc);
    sequence.push_back(constIntNode);
    constIntNode = addConstantUnion(selector.coord2, loc);
    sequence.push_back(constIntNode);
}